

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O2

int32_t __thiscall icu_63::UnifiedCache::_computeCountOfItemsToEvict(UnifiedCache *this)

{
  int32_t iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = uhash_count_63(this->fHashtable);
  iVar2 = (this->fMaxPercentageOfInUse * this->fNumValuesInUse) / 100;
  iVar3 = this->fMaxUnused;
  if (this->fMaxUnused < iVar2) {
    iVar3 = iVar2;
  }
  iVar3 = iVar1 - (iVar3 + this->fNumValuesInUse);
  iVar1 = 0;
  if (0 < iVar3) {
    iVar1 = iVar3;
  }
  return iVar1;
}

Assistant:

int32_t UnifiedCache::_computeCountOfItemsToEvict() const {
    int32_t totalItems = uhash_count(fHashtable);
    int32_t evictableItems = totalItems - fNumValuesInUse;

    int32_t unusedLimitByPercentage = fNumValuesInUse * fMaxPercentageOfInUse / 100;
    int32_t unusedLimit = std::max(unusedLimitByPercentage, fMaxUnused);
    int32_t countOfItemsToEvict = std::max(0, evictableItems - unusedLimit);
    return countOfItemsToEvict;
}